

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

char * get_func_static_var_name(c2m_ctx_t c2m_ctx,char *suffix,decl_t decl)

{
  gen_ctx_conflict *pgVar1;
  VARR_char *pVVar2;
  char *pcVar3;
  MIR_item_t pMVar4;
  MIR_module_t pMVar5;
  MIR_item_t pMVar6;
  MIR_item_t_conflict pMVar7;
  char *name;
  MIR_item_t pMVar8;
  c2m_ctx_t pcVar9;
  DLIST_MIR_item_t *list;
  str_t sVar10;
  char prefix [50];
  char acStack_58 [64];
  
  sprintf(acStack_58,"S%u_");
  pgVar1 = c2m_ctx->gen_ctx;
  if (pgVar1->curr_func == (MIR_item_t)0x0) {
LAB_001a9b12:
    __assert_fail("curr_func != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x2b4e,"const char *get_func_var_name(c2m_ctx_t, const char *, const char *)");
  }
  pVVar2 = c2m_ctx->temp_string;
  if ((pVVar2 == (VARR_char *)0x0) || (pVVar2->varr == (char *)0x0)) {
    get_func_static_var_name_cold_2();
    goto LAB_001a9b12;
  }
  pVVar2->els_num = 0;
  add_to_temp_string(c2m_ctx,acStack_58);
  add_to_temp_string(c2m_ctx,((pgVar1->curr_func->u).func)->name);
  add_to_temp_string(c2m_ctx,"_");
  pcVar9 = c2m_ctx;
  add_to_temp_string(c2m_ctx,suffix);
  if (c2m_ctx->temp_string != (VARR_char *)0x0) {
    sVar10 = uniq_cstr(c2m_ctx,c2m_ctx->temp_string->varr);
    return sVar10.s;
  }
  get_func_static_var_name_cold_1();
  pcVar3 = (char *)pcVar9->env[0].__saved_mask.__val[0xd];
  if (pcVar3 == (char *)0x0) {
    __assert_fail("curr_func != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x2d6f,"void move_item_forward(c2m_ctx_t, MIR_item_t)");
  }
  if (*(MIR_item_t *)(*(long *)(pcVar3 + 8) + 0x18) != (MIR_item_t)suffix) {
    return pcVar3;
  }
  list = (DLIST_MIR_item_t *)(*(long *)(pcVar3 + 8) + 0x10);
  pMVar8 = (MIR_item_t)suffix;
  DLIST_MIR_item_t_remove(list,(MIR_item_t)suffix);
  if ((((MIR_item_t)suffix == (MIR_item_t)0x0) ||
      (pMVar4 = (MIR_item_t)pcVar9->env[0].__saved_mask.__val[0xd], pMVar4 == (MIR_item_t)0x0)) ||
     (pMVar5 = pMVar4->module, (pMVar5->items).tail == (MIR_item_t_conflict)0x0)) {
    move_item_forward_cold_3();
  }
  else {
    pMVar6 = (pMVar4->item_link).prev;
    pMVar8 = (pMVar5->items).head;
    if (pMVar6 == (MIR_item_t)0x0) {
      if (pMVar8 == pMVar4) {
        (pMVar4->item_link).prev = (MIR_item_t)suffix;
        (((MIR_item_t)suffix)->item_link).next = pMVar4;
        (((MIR_item_t)suffix)->item_link).prev = (MIR_item_t)0x0;
        (pMVar5->items).head = (MIR_item_t_conflict)suffix;
        return (char *)pMVar4;
      }
      goto LAB_001a9bec;
    }
    if (pMVar8 != (MIR_item_t)0x0) {
      (pMVar6->item_link).next = (MIR_item_t)suffix;
      (((MIR_item_t)suffix)->item_link).prev = pMVar6;
      (pMVar4->item_link).prev = (MIR_item_t)suffix;
      (((MIR_item_t)suffix)->item_link).next = pMVar4;
      return (char *)pMVar4;
    }
  }
  move_item_forward_cold_1();
LAB_001a9bec:
  move_item_forward_cold_2();
  pMVar5 = pMVar8->module;
  if ((*(int *)&pMVar8->data != 0x7d) &&
     (((*(int *)&pMVar8->data != 0x55 || (**(int **)(*(long *)&pMVar8->item_type + 0x18) != 0x5d))
      || (((pMVar5->items).tail != list[0x18].head ||
          ((*(int *)(pMVar5[1].name + 0x18) == 7 || (((ulong)(pMVar5->module_link).next & 3) != 0)))
          ))))) {
    return (char *)0x0;
  }
  if (*(int *)&pMVar5[1].data != 0x58) {
    pMVar7 = MIR_new_forward((MIR_context_t)list->head,name);
    return (char *)pMVar7;
  }
  pMVar7 = MIR_new_export((MIR_context_t)list->head,name);
  return (char *)pMVar7;
}

Assistant:

static const char *get_func_static_var_name (c2m_ctx_t c2m_ctx, const char *suffix, decl_t decl) {
  char prefix[50];
  unsigned func_scope_num = ((struct node_scope *) decl->scope->attr)->func_scope_num;

  sprintf (prefix, "S%u_", func_scope_num);
  return get_func_var_name (c2m_ctx, prefix, suffix);
}